

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermSymbol * __thiscall
glslang::HlslParseContext::findTessLinkageSymbol(HlslParseContext *this,TBuiltInVariable biType)

{
  TIntermediate *this_00;
  const_iterator cVar1;
  TVariable *variable;
  TIntermSymbol *pTVar2;
  TBuiltInVariable local_c;
  
  local_c = biType;
  cVar1 = std::
          _Rb_tree<glslang::TBuiltInVariable,_std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
          ::find((_Rb_tree<glslang::TBuiltInVariable,_std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
                  *)&this->builtInTessLinkageSymbols,&local_c);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->builtInTessLinkageSymbols).
       super_map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    pTVar2 = (TIntermSymbol *)0x0;
  }
  else {
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    variable = (TVariable *)(**(code **)(*(long *)cVar1._M_node[1]._M_parent + 0x48))();
    pTVar2 = TIntermediate::addSymbol(this_00,variable);
  }
  return pTVar2;
}

Assistant:

TIntermSymbol* HlslParseContext::findTessLinkageSymbol(TBuiltInVariable biType) const
{
    const auto it = builtInTessLinkageSymbols.find(biType);
    if (it == builtInTessLinkageSymbols.end())  // if it wasn't declared by the user, return nullptr
        return nullptr;

    return intermediate.addSymbol(*it->second->getAsVariable());
}